

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

optional<unsigned_int> convert_gram(IndexType type,uint64_t source)

{
  size_t __n;
  TrigramGenerator p_Var1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mem;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  __n = get_ngram_size_for(type);
  local_88._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,__n);
  lVar4 = __n * 8;
  while (lVar4 = lVar4 + -8, lVar4 != -8) {
    local_50._M_pod_data[0] = (char)(source >> ((byte)lVar4 & 0x3f));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               (uchar *)local_50._M_pod_data);
  }
  p_Var1 = get_generator_for(type);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_88;
  (*p_Var1)(local_68._M_impl.super__Vector_impl_data._M_start,__n,(TrigramCallback *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  if (local_88._M_impl.super__Vector_impl_data._M_start ==
      local_88._M_impl.super__Vector_impl_data._M_finish) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)*local_88._M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0x100000000;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar3 | uVar2);
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, uint64_t source) {
    int size = get_ngram_size_for(type);
    std::vector<TriGram> result;
    std::vector<uint8_t> mem;
    mem.reserve(size);
    for (int i = 0; i < size; i++) {
        mem.push_back(((source) >> ((size - i - 1) * 8)) & 0xFF);
    }
    get_generator_for(type)(
        mem.data(), size, [&result](uint32_t gram) { result.push_back(gram); });
    if (result.empty()) {
        return std::nullopt;
    }
    return std::make_optional(result[0]);
}